

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bytestrie.cpp
# Opt level: O1

void icu_63::BytesTrie::getNextBranchBytes(uint8_t *pos,int32_t length,ByteSink *out)

{
  byte bVar1;
  int32_t length_00;
  uint8_t *pos_00;
  int iVar2;
  ulong uVar3;
  uint8_t *puVar4;
  char ch;
  uint8_t local_2a;
  uint8_t local_29;
  
  uVar3 = (ulong)(uint)length;
  puVar4 = pos;
  if (5 < length) {
    do {
      pos_00 = jumpByDelta(puVar4 + 1);
      length_00 = (int32_t)(uVar3 >> 1);
      getNextBranchBytes(pos_00,length_00,out);
      pos = puVar4 + 2;
      bVar1 = puVar4[1];
      if (0xbf < bVar1) {
        if (bVar1 < 0xf0) {
          pos = puVar4 + 3;
        }
        else if (bVar1 < 0xfe) {
          pos = puVar4 + 4;
        }
        else {
          pos = pos + (ulong)(bVar1 & 1) + 3;
        }
      }
      length = (int)uVar3 - length_00;
      uVar3 = (ulong)(uint)length;
      puVar4 = pos;
    } while (5 < length);
  }
  iVar2 = length + 1;
  do {
    local_2a = *pos;
    (*out->_vptr_ByteSink[2])(out,&local_2a,1);
    puVar4 = pos + 2;
    bVar1 = pos[1];
    if (0xa1 < bVar1) {
      if (bVar1 < 0xd8) {
        puVar4 = pos + 3;
      }
      else if (bVar1 < 0xfc) {
        puVar4 = pos + 4;
      }
      else {
        puVar4 = pos + (ulong)((bVar1 >> 1 & 1) != 0) + 5;
      }
    }
    iVar2 = iVar2 + -1;
    pos = puVar4;
  } while (2 < iVar2);
  local_29 = *puVar4;
  (*out->_vptr_ByteSink[2])(out,&local_29,1);
  return;
}

Assistant:

void
BytesTrie::getNextBranchBytes(const uint8_t *pos, int32_t length, ByteSink &out) {
    while(length>kMaxBranchLinearSubNodeLength) {
        ++pos;  // ignore the comparison byte
        getNextBranchBytes(jumpByDelta(pos), length>>1, out);
        length=length-(length>>1);
        pos=skipDelta(pos);
    }
    do {
        append(out, *pos++);
        pos=skipValue(pos);
    } while(--length>1);
    append(out, *pos);
}